

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat * __thiscall Mat::operator*(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer p_Var4;
  pointer p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong *puVar24;
  long lVar25;
  ulong *puVar26;
  ulong *puVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  long local_78;
  ulong *local_68;
  long local_48;
  
  lVar18 = (long)a->c;
  Mat(__return_storage_ptr__,this->r,a->c);
  if (0 < lVar18) {
    iVar1 = this->order;
    iVar2 = a->order;
    uVar13 = this->r;
    uVar22 = (ulong)uVar13;
    local_48 = 0;
    local_78 = 0;
    do {
      if (0 < (int)uVar13) {
        uVar3 = this->c;
        uVar16 = (ulong)uVar3;
        puVar27 = (ulong *)(this->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
                           _M_impl.super__Vector_impl_data._M_start;
        p_Var4 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar20 = local_78 * uVar22;
        p_Var5 = (__return_storage_ptr__->val).
                 super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar19 = uVar16 * 0x10;
        uVar17 = (int)local_78 * uVar3;
        uVar28 = 0;
        local_68 = puVar27;
        do {
          switch(iVar1 * 2 + iVar2) {
          case 0:
            if (0 < (int)uVar3) {
              uVar21 = *(ulong *)(p_Var5 + lVar20 + uVar28);
              uVar23 = *(ulong *)((long)p_Var5 + uVar28 * 0x10 + lVar20 * 0x10 + 8);
              lVar25 = 0;
              puVar24 = local_68;
              do {
                uVar15 = *(ulong *)((long)p_Var4 + lVar25 + (ulong)uVar17 * 0x10);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar15;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *puVar24;
                uVar14 = SUB168(auVar6 * auVar9,0);
                bVar29 = CARRY8(uVar21,uVar14);
                uVar21 = uVar21 + uVar14;
                uVar23 = uVar23 + SUB168(auVar6 * auVar9,8) + puVar24[1] * uVar15 +
                                  *(long *)((long)p_Var4 + lVar25 + (ulong)uVar17 * 0x10 + 8) *
                                  *puVar24 + (ulong)bVar29;
                *(ulong *)(p_Var5 + lVar20 + uVar28) = uVar21;
                *(ulong *)((long)(p_Var5 + lVar20 + uVar28) + 8) = uVar23;
                lVar25 = lVar25 + 0x10;
                puVar24 = puVar24 + uVar22 * 2;
              } while (lVar19 != lVar25);
            }
            break;
          case 1:
            if (0 < (int)uVar3) {
              uVar21 = *(ulong *)(p_Var5 + lVar20 + uVar28);
              uVar23 = *(ulong *)((long)p_Var5 + uVar28 * 0x10 + lVar20 * 0x10 + 8);
              puVar24 = local_68;
              uVar15 = uVar16;
              puVar26 = (ulong *)(local_48 + (long)p_Var4);
              do {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *puVar26;
                auVar12._8_8_ = 0;
                auVar12._0_8_ = *puVar24;
                uVar14 = SUB168(auVar8 * auVar12,0);
                bVar29 = CARRY8(uVar21,uVar14);
                uVar21 = uVar21 + uVar14;
                uVar23 = uVar23 + *puVar24 * puVar26[1] +
                                  SUB168(auVar8 * auVar12,8) + puVar24[1] * *puVar26 + (ulong)bVar29
                ;
                *(ulong *)(p_Var5 + lVar20 + uVar28) = uVar21;
                *(ulong *)((long)(p_Var5 + lVar20 + uVar28) + 8) = uVar23;
                puVar26 = puVar26 + lVar18 * 2;
                puVar24 = puVar24 + uVar22 * 2;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
            break;
          case 2:
            if (0 < (int)uVar3) {
              uVar21 = *(ulong *)(p_Var5 + lVar20 + uVar28);
              uVar23 = *(ulong *)((long)p_Var5 + uVar28 * 0x10 + lVar20 * 0x10 + 8);
              lVar25 = 0;
              do {
                uVar15 = *(ulong *)((long)p_Var4 + lVar25 + (ulong)uVar17 * 0x10);
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar15;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)((long)puVar27 + lVar25);
                uVar14 = SUB168(auVar7 * auVar10,0);
                bVar29 = CARRY8(uVar21,uVar14);
                uVar21 = uVar21 + uVar14;
                uVar23 = uVar23 + *(ulong *)((long)puVar27 + lVar25) *
                                  *(long *)((long)p_Var4 + lVar25 + (ulong)uVar17 * 0x10 + 8) +
                                  uVar15 * *(long *)((long)puVar27 + lVar25 + 8) +
                                  SUB168(auVar7 * auVar10,8) + (ulong)bVar29;
                *(ulong *)(p_Var5 + lVar20 + uVar28) = uVar21;
                *(ulong *)((long)(p_Var5 + lVar20 + uVar28) + 8) = uVar23;
                lVar25 = lVar25 + 0x10;
              } while (lVar19 != lVar25);
            }
            break;
          case 3:
            if (0 < (int)uVar3) {
              uVar21 = *(ulong *)(p_Var5 + lVar20 + uVar28);
              uVar23 = *(ulong *)((long)p_Var5 + uVar28 * 0x10 + lVar20 * 0x10 + 8);
              lVar25 = 0;
              puVar24 = (ulong *)(local_48 + (long)p_Var4);
              do {
                auVar30._8_8_ = 0;
                auVar30._0_8_ = *puVar24;
                auVar11._8_8_ = 0;
                auVar11._0_8_ = *(ulong *)((long)puVar27 + lVar25);
                uVar15 = SUB168(auVar30 * auVar11,0);
                bVar29 = CARRY8(uVar21,uVar15);
                uVar21 = uVar21 + uVar15;
                uVar23 = uVar23 + *(ulong *)((long)puVar27 + lVar25) * puVar24[1] +
                                  SUB168(auVar30 * auVar11,8) +
                                  *(long *)((long)puVar27 + lVar25 + 8) * *puVar24 + (ulong)bVar29;
                *(ulong *)(p_Var5 + lVar20 + uVar28) = uVar21;
                *(ulong *)((long)(p_Var5 + lVar20 + uVar28) + 8) = uVar23;
                lVar25 = lVar25 + 0x10;
                puVar24 = puVar24 + lVar18 * 2;
              } while (lVar19 != lVar25);
            }
          }
          uVar28 = uVar28 + 1;
          puVar27 = puVar27 + uVar16 * 2;
          local_68 = local_68 + 2;
        } while (uVar28 != uVar22);
      }
      local_78 = local_78 + 1;
      local_48 = local_48 + 0x10;
    } while (local_78 != lVar18);
  }
  uVar13 = __return_storage_ptr__->c * __return_storage_ptr__->r;
  if (0 < (int)uVar13) {
    p_Var4 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar18 = 0;
    do {
      auVar30 = __modti3(*(undefined8 *)((long)p_Var4 + lVar18),
                         *(undefined8 *)((long)p_Var4 + lVar18 + 8),0x16345785d8a0003,0);
      auVar30 = __umodti3(auVar30._0_8_ + 0x16345785d8a0003,
                          auVar30._8_8_ + (ulong)(0xfe9cba87a275fffc < auVar30._0_8_),
                          0x16345785d8a0003);
      *(long *)((long)p_Var4 + lVar18) = auVar30._0_8_;
      *(long *)((long)p_Var4 + lVar18 + 8) = auVar30._8_8_;
      lVar18 = lVar18 + 0x10;
    } while ((ulong)uVar13 << 4 != lVar18);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator*(const Mat &a) {
    int tmp_c;
    tmp_c = a.cols();
    Mat ret(r, a.cols());
    int i, j;
    for (int j = 0; j < tmp_c; j++) {
        for (int i = 0; i < r; i++) {
            switch (pair_order_type(this, &a)) {
                case MM_NN:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[k * r + i] * a.val[j * c + k];
                    }
                    break;
                case MM_NT:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[k * r + i] * a.val[k * tmp_c + j];
                    }
                    break;
                case MM_TN:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[i * c + k] * a.val[j * c + k];
                    }
                    break;
                case MM_TT:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[i * c + k] * a.val[k * tmp_c + j];
                    }
                    break;
            }
        }
    }
    ret.residual();
    return ret;
}